

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManIncrementTravId(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *local_20;
  Gia_Man_t *p_local;
  
  if (p->pTravIds == (int *)0x0) {
    iVar1 = Gia_ManObjNum(p);
    p->nTravIdsAlloc = iVar1 + 100;
    piVar3 = (int *)calloc((long)p->nTravIdsAlloc,4);
    p->pTravIds = piVar3;
    p->nTravIds = 0;
  }
  while (iVar1 = p->nTravIdsAlloc, iVar2 = Gia_ManObjNum(p), iVar1 < iVar2) {
    p->nTravIdsAlloc = p->nTravIdsAlloc << 1;
    if (p->pTravIds == (int *)0x0) {
      local_20 = (int *)malloc((long)p->nTravIdsAlloc << 2);
    }
    else {
      local_20 = (int *)realloc(p->pTravIds,(long)p->nTravIdsAlloc << 2);
    }
    p->pTravIds = local_20;
    memset(p->pTravIds + p->nTravIdsAlloc / 2,0,(ulong)((long)p->nTravIdsAlloc << 2) >> 1);
  }
  p->nTravIds = p->nTravIds + 1;
  return;
}

Assistant:

void Gia_ManIncrementTravId( Gia_Man_t * p )                     
{ 
    if ( p->pTravIds == NULL )
    {
        p->nTravIdsAlloc = Gia_ManObjNum(p) + 100; 
        p->pTravIds = ABC_CALLOC( int, p->nTravIdsAlloc ); 
        p->nTravIds = 0;  
    }
    while ( p->nTravIdsAlloc < Gia_ManObjNum(p) )
    {
        p->nTravIdsAlloc *= 2;
        p->pTravIds = ABC_REALLOC( int, p->pTravIds, p->nTravIdsAlloc );
        memset( p->pTravIds + p->nTravIdsAlloc/2, 0, sizeof(int) * p->nTravIdsAlloc/2 );
    }
    p->nTravIds++;                                                    
}